

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O1

bool __thiscall
MeCab::DictionaryRewriter::rewrite
          (DictionaryRewriter *this,string *feature,string *ufeature,string *lfeature,
          string *rfeature)

{
  char *pcVar1;
  char cVar2;
  DictionaryRewriter *this_00;
  bool bVar3;
  char *pcVar4;
  char **ppcVar5;
  ostream *poVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  ulong size;
  die local_64;
  die local_63;
  undefined1 local_62;
  undefined1 local_61;
  char **local_60;
  char *local_58;
  string *local_50;
  string *local_48;
  DictionaryRewriter *local_40;
  string *local_38;
  
  local_48 = lfeature;
  local_38 = ufeature;
  pcVar4 = (char *)operator_new__(0x2000);
  local_58 = pcVar4;
  ppcVar5 = (char **)operator_new__(0x10000);
  local_60 = ppcVar5;
  if (0x1ffe < feature->_M_string_length) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
               ,0x79);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"feature.size() < buf.size() - 1",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"too long feature",0x10);
    die::~die(&local_63);
  }
  local_50 = rfeature;
  local_40 = this;
  strncpy(pcVar4,(feature->_M_dataplus)._M_p,0x1fff);
  sVar7 = strlen(pcVar4);
  if ((long)sVar7 < 1) {
    size = 0;
  }
  else {
    pcVar9 = pcVar4 + sVar7;
    uVar12 = 0x2000;
    size = 0;
    do {
      for (; (cVar2 = *pcVar4, cVar2 == '\t' || (cVar2 == ' ')); pcVar4 = pcVar4 + 1) {
      }
      if (cVar2 == '\"') {
        pcVar4 = pcVar4 + 1;
        pcVar11 = pcVar4;
        for (pcVar8 = pcVar4;
            (pcVar10 = pcVar8, pcVar8 < pcVar9 &&
            ((*pcVar8 != '\"' ||
             (pcVar10 = pcVar8 + 1, pcVar1 = pcVar8 + 1, pcVar8 = pcVar10, *pcVar1 == '\"'))));
            pcVar8 = pcVar8 + 1) {
          *pcVar11 = *pcVar8;
          pcVar11 = pcVar11 + 1;
        }
        local_61 = 0x2c;
        pcVar8 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (pcVar10,pcVar9,&local_61);
      }
      else {
        local_62 = 0x2c;
        pcVar8 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (pcVar4,pcVar9,&local_62);
        pcVar11 = pcVar8;
      }
      if (1 < uVar12) {
        *pcVar11 = '\0';
      }
      uVar12 = uVar12 - 1;
      *ppcVar5 = pcVar4;
      size = size + 1;
      if (uVar12 == 0) break;
      ppcVar5 = ppcVar5 + 1;
      pcVar4 = pcVar8 + 1;
    } while (pcVar4 < pcVar9);
  }
  this_00 = local_40;
  pcVar4 = local_58;
  ppcVar5 = local_60;
  if (0x1fff < size) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
               ,0x79);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xab);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"n < col.size()",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"too long CSV entities",0x15);
    die::~die(&local_64);
  }
  bVar3 = RewriteRules::rewrite(&this_00->unigram_rewrite_,size,ppcVar5,local_38);
  if ((bVar3) &&
     (bVar3 = RewriteRules::rewrite(&this_00->left_rewrite_,size,ppcVar5,local_48), bVar3)) {
    bVar3 = RewriteRules::rewrite(&this_00->right_rewrite_,size,ppcVar5,local_50);
  }
  else {
    bVar3 = false;
  }
  operator_delete__(ppcVar5);
  operator_delete__(pcVar4);
  return bVar3;
}

Assistant:

bool DictionaryRewriter::rewrite(const std::string &feature,
                                 std::string *ufeature,
                                 std::string *lfeature,
                                 std::string *rfeature) const {
  scoped_fixed_array<char, BUF_SIZE> buf;
  scoped_fixed_array<char *, BUF_SIZE> col;
  CHECK_DIE(feature.size() < buf.size() - 1) << "too long feature";
  std::strncpy(buf.get(), feature.c_str(), buf.size() - 1);
  const size_t n = tokenizeCSV(buf.get(), col.get(), col.size());
  CHECK_DIE(n < col.size()) << "too long CSV entities";
  return (unigram_rewrite_.rewrite(n, const_cast<const char **>(col.get()),
                                   ufeature) &&
          left_rewrite_.rewrite(n, const_cast<const char **>(col.get()),
                                lfeature) &&
          right_rewrite_.rewrite(n, const_cast<const char **>(col.get()),
                                 rfeature));
}